

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O1

void rtcAttachGeometryByID(RTCScene hscene,RTCGeometry hgeometry,uint geomID)

{
  undefined8 *puVar1;
  socklen_t in_ECX;
  DeviceEnterLeave enterleave;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  RTCGeometry local_40;
  DeviceEnterLeave local_38;
  
  if (hscene == (RTCScene)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"invalid argument","");
    *puVar1 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar1 + 1) = 2;
    puVar1[2] = puVar1 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_60,local_60 + local_58);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  if (hgeometry == (RTCGeometry)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"invalid argument","");
    *puVar1 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar1 + 1) = 2;
    puVar1[2] = puVar1 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_60,local_60 + local_58);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  if (geomID == 0xffffffff) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"invalid argument","");
    *puVar1 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar1 + 1) = 2;
    puVar1[2] = puVar1 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_60,local_60 + local_58);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  embree::DeviceEnterLeave::DeviceEnterLeave(&local_38,hscene);
  if (*(long *)(hscene + 0x188) == *(long *)(hgeometry + 0x10)) {
    local_40 = hgeometry;
    (**(code **)(*(long *)hgeometry + 0x10))(hgeometry);
    embree::Scene::bind((Scene *)hscene,geomID,(sockaddr *)&local_40,in_ECX);
    if (local_40 != (RTCGeometry)0x0) {
      (**(code **)(*(long *)local_40 + 0x18))();
    }
    embree::DeviceEnterLeave::~DeviceEnterLeave(&local_38);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"inputs are from different devices","");
  *puVar1 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar1 + 1) = 2;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_60,local_60 + local_58);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcAttachGeometryByID (RTCScene hscene, RTCGeometry hgeometry, unsigned int geomID)
  {
    Scene* scene = (Scene*) hscene;
    Geometry* geometry = (Geometry*) hgeometry;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcAttachGeometryByID);
    RTC_VERIFY_HANDLE(hscene);
    RTC_VERIFY_HANDLE(hgeometry);
    RTC_VERIFY_GEOMID(geomID);
    RTC_ENTER_DEVICE(hscene);
    if (scene->device != geometry->device)
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"inputs are from different devices");
    scene->bind(geomID,geometry);
    RTC_CATCH_END2(scene);
  }